

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

void __thiscall QAccessibleTableCell::unselectCell(QAccessibleTableCell *this)

{
  bool bVar1;
  bool bVar2;
  SelectionMode SVar3;
  SelectionBehavior SVar4;
  undefined4 uVar5;
  ulong uVar6;
  QAccessibleTableInterface *pQVar7;
  qsizetype qVar8;
  QItemSelectionModel *this_00;
  long *in_RDI;
  long in_FS_OFFSET;
  QAccessibleTableInterface *cellTable;
  SelectionMode selectionMode;
  SelectionFlag in_stack_ffffffffffffff6c;
  QAbstractItemView *in_stack_ffffffffffffff70;
  undefined4 local_3c;
  QPersistentModelIndex local_38 [3];
  QList<QModelIndex> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = (**(code **)(*in_RDI + 0x10))();
  if ((uVar6 & 1) != 0) {
    QPointer<QAbstractItemView>::operator->((QPointer<QAbstractItemView> *)0x7f5098);
    SVar3 = QAbstractItemView::selectionMode(in_stack_ffffffffffffff70);
    if (SVar3 != NoSelection) {
      (**(code **)(*in_RDI + 0xe0))();
      pQVar7 = QAccessibleInterface::tableInterface((QAccessibleInterface *)0x7f50c9);
      QPointer<QAbstractItemView>::operator->((QPointer<QAbstractItemView> *)0x7f50dc);
      SVar4 = QAbstractItemView::selectionBehavior(in_stack_ffffffffffffff70);
      if (SVar4 != SelectItems) {
        if (SVar4 == SelectRows) {
          if (pQVar7 != (QAccessibleTableInterface *)0x0) {
            uVar5 = QPersistentModelIndex::row();
            (**(code **)(*(long *)pQVar7 + 0x98))(pQVar7,uVar5);
          }
          goto LAB_007f5248;
        }
        if (SVar4 == SelectColumns) {
          if (pQVar7 != (QAccessibleTableInterface *)0x0) {
            uVar5 = QPersistentModelIndex::column();
            (**(code **)(*(long *)pQVar7 + 0xa0))(pQVar7,uVar5);
          }
          goto LAB_007f5248;
        }
      }
      bVar2 = false;
      bVar1 = false;
      if ((SVar3 != MultiSelection) && (bVar1 = false, SVar3 != ExtendedSelection)) {
        QPointer<QAbstractItemView>::operator->((QPointer<QAbstractItemView> *)0x7f51a1);
        QAbstractItemView::selectionModel(in_stack_ffffffffffffff70);
        QItemSelectionModel::selectedIndexes();
        bVar2 = true;
        qVar8 = QList<QModelIndex>::size(&local_20);
        bVar1 = qVar8 < 2;
      }
      if (bVar2) {
        QList<QModelIndex>::~QList((QList<QModelIndex> *)0x7f51eb);
      }
      if (!bVar1) {
        QPointer<QAbstractItemView>::operator->((QPointer<QAbstractItemView> *)0x7f5205);
        this_00 = QAbstractItemView::selectionModel(in_stack_ffffffffffffff70);
        QPersistentModelIndex::operator_cast_to_QModelIndex(local_38);
        QFlags<QItemSelectionModel::SelectionFlag>::QFlags
                  ((QFlags<QItemSelectionModel::SelectionFlag> *)this_00,in_stack_ffffffffffffff6c);
        (**(code **)(*(long *)this_00 + 0x68))(this_00,local_38,local_3c);
      }
    }
  }
LAB_007f5248:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAccessibleTableCell::unselectCell()
{
    if (!isValid())
        return;
    QAbstractItemView::SelectionMode selectionMode = view->selectionMode();
    if (selectionMode == QAbstractItemView::NoSelection)
        return;

    QAccessibleTableInterface *cellTable = table()->tableInterface();

    switch (view->selectionBehavior()) {
    case QAbstractItemView::SelectItems:
        break;
    case QAbstractItemView::SelectColumns:
        if (cellTable)
            cellTable->unselectColumn(m_index.column());
        return;
    case QAbstractItemView::SelectRows:
        if (cellTable)
            cellTable->unselectRow(m_index.row());
        return;
    }

    //If the mode is not MultiSelection or ExtendedSelection and only
    //one cell is selected it cannot be unselected by the user
    if ((selectionMode != QAbstractItemView::MultiSelection)
        && (selectionMode != QAbstractItemView::ExtendedSelection)
        && (view->selectionModel()->selectedIndexes().size() <= 1))
        return;

    view->selectionModel()->select(m_index, QItemSelectionModel::Deselect);
}